

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> * __thiscall
toml::detail::
sequence<toml::detail::sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>>>
::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,
          sequence<toml::detail::sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>>>
          *this,location *loc,region *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  value_type *other;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  result<toml::detail::region,_toml::detail::none_t> local_c0;
  region local_70;
  
  sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>_>
  ::invoke(&local_c0,(location *)this);
  if (local_c0.is_ok_ == false) {
    location::reset((location *)this,(const_iterator)reg);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    other = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_c0);
    region::operator+=((region *)loc,other);
    region::region(&local_70,(region *)loc);
    reg = &local_70;
    result<toml::detail::region,_toml::detail::none_t>::result
              (__return_storage_ptr__,(success_type *)&local_70);
    region::~region(&local_70);
  }
  result<toml::detail::region,_toml::detail::none_t>::cleanup(&local_c0,(EVP_PKEY_CTX *)reg);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc, region reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return ok(reg);
    }